

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStringAs(PrintExpressionContents *this,StringAs *curr)

{
  if ((ulong)curr->op < 3) {
    printMedium(this->o,&DAT_00bbf37c + *(int *)(&DAT_00bbf37c + (ulong)curr->op * 4));
    return;
  }
  handle_unreachable("invalid string.as*",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                     ,0x9b8);
}

Assistant:

void visitStringAs(StringAs* curr) {
    switch (curr->op) {
      case StringAsWTF8:
        printMedium(o, "string.as_wtf8");
        break;
      case StringAsWTF16:
        printMedium(o, "string.as_wtf16");
        break;
      case StringAsIter:
        printMedium(o, "string.as_iter");
        break;
      default:
        WASM_UNREACHABLE("invalid string.as*");
    }
  }